

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O3

bool (anonymous_namespace)::qt_ends_with_impl<QStringView,QStringView>
               (QStringView haystack,QStringView needle,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  int iVar2;
  storage_type_conflict *psVar3;
  long lVar4;
  QStringView lhs;
  
  lVar4 = haystack.m_size;
  psVar3 = (storage_type_conflict *)needle.m_size;
  psVar1 = needle.m_data;
  if ((haystack.m_data != (storage_type_conflict *)0x0) && (psVar1 = psVar3, lVar4 != 0)) {
    if ((long)psVar3 <= lVar4) {
      lhs.m_data = haystack.m_data + (lVar4 - (long)psVar3);
      lhs.m_size = (qsizetype)psVar3;
      iVar2 = QtPrivate::compareStrings(lhs,needle,cs);
      return iVar2 == 0;
    }
    return false;
  }
  return psVar1 == (storage_type_conflict *)0x0;
}

Assistant:

[[nodiscard]] constexpr bool isNull() const noexcept { return !m_data; }